

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

FunctionPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPortListSyntax,slang::syntax::FunctionPortListSyntax_const&>
          (BumpAllocator *this,FunctionPortListSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  FunctionPortListSyntax *pFVar8;
  
  pFVar8 = (FunctionPortListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FunctionPortListSyntax *)this->endPtr < pFVar8 + 1) {
    pFVar8 = (FunctionPortListSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pFVar8 + 1);
  }
  (pFVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pFVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pFVar8->super_SyntaxNode).field_0x4 = uVar4;
  (pFVar8->super_SyntaxNode).parent = pSVar1;
  uVar5 = (args->openParen).field_0x2;
  NVar6.raw = (args->openParen).numFlags.raw;
  uVar7 = (args->openParen).rawLen;
  pIVar2 = (args->openParen).info;
  (pFVar8->openParen).kind = (args->openParen).kind;
  (pFVar8->openParen).field_0x2 = uVar5;
  (pFVar8->openParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pFVar8->openParen).rawLen = uVar7;
  (pFVar8->openParen).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->ports).super_SyntaxListBase.super_SyntaxNode.parent;
  (pFVar8->ports).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->ports).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar8->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pFVar8->ports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pFVar8->ports).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->ports).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pFVar8->ports).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (pFVar8->ports).super_SyntaxListBase.childCount = (args->ports).super_SyntaxListBase.childCount;
  (pFVar8->ports).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0062f860;
  sVar3 = (args->ports).elements._M_extent._M_extent_value;
  (pFVar8->ports).elements._M_ptr = (args->ports).elements._M_ptr;
  (pFVar8->ports).elements._M_extent._M_extent_value = sVar3;
  uVar5 = (args->closeParen).field_0x2;
  NVar6.raw = (args->closeParen).numFlags.raw;
  uVar7 = (args->closeParen).rawLen;
  pIVar2 = (args->closeParen).info;
  (pFVar8->closeParen).kind = (args->closeParen).kind;
  (pFVar8->closeParen).field_0x2 = uVar5;
  (pFVar8->closeParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pFVar8->closeParen).rawLen = uVar7;
  (pFVar8->closeParen).info = pIVar2;
  return pFVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }